

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

RefEq * __thiscall wasm::Builder::makeRefEq(Builder *this,Expression *left,Expression *right)

{
  RefEq *this_00;
  
  this_00 = (RefEq *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression._id = RefEqId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression.type.id = 0;
  this_00->left = left;
  this_00->right = right;
  RefEq::finalize(this_00);
  return this_00;
}

Assistant:

RefEq* makeRefEq(Expression* left, Expression* right) {
    auto* ret = wasm.allocator.alloc<RefEq>();
    ret->left = left;
    ret->right = right;
    ret->finalize();
    return ret;
  }